

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere_hierarchy_visualize.hpp
# Opt level: O3

vector<SphereTree,_std::allocator<SphereTree>_> *
nextlayer(vector<SphereTree,_std::allocator<SphereTree>_> *__return_storage_ptr__,
         vector<SphereTree,_std::allocator<SphereTree>_> *v)

{
  pointer pSVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  pointer pSVar2;
  SphereTree t;
  undefined8 uVar3;
  undefined8 uVar4;
  vector<SphereTree,_std::allocator<SphereTree>_> local_38;
  
  (__return_storage_ptr__->super__Vector_base<SphereTree,_std::allocator<SphereTree>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SphereTree,_std::allocator<SphereTree>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SphereTree,_std::allocator<SphereTree>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar2 = (v->super__Vector_base<SphereTree,_std::allocator<SphereTree>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pSVar1 = (v->super__Vector_base<SphereTree,_std::allocator<SphereTree>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar2 != pSVar1) {
    do {
      uVar3._0_4_ = (pSVar2->bound).center.x;
      uVar3._4_4_ = (pSVar2->bound).center.y;
      uVar4 = *(undefined8 *)&(pSVar2->bound).center.z;
      std::vector<SphereTree,_std::allocator<SphereTree>_>::vector(&local_38,&pSVar2->child);
      std::vector<SphereTree,std::allocator<SphereTree>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<SphereTree*,std::vector<SphereTree,std::allocator<SphereTree>>>>
                ((vector<SphereTree,std::allocator<SphereTree>> *)__return_storage_ptr__,
                 (__return_storage_ptr__->
                 super__Vector_base<SphereTree,_std::allocator<SphereTree>_>)._M_impl.
                 super__Vector_impl_data._M_finish,
                 local_38.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_38.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                 super__Vector_impl_data._M_finish,in_R8,in_R9,uVar3,uVar4);
      std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector(&local_38);
      pSVar2 = pSVar2 + 1;
    } while (pSVar2 != pSVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SphereTree> nextlayer(const std::vector<SphereTree>& v)
{
	std::vector<SphereTree> cur;
	for (auto t: v)
		cur.insert(cur.end(), t.child.begin(), t.child.end());
	return cur;
}